

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void MirrorRow_C(uint8_t *src,uint8_t *dst,int width)

{
  long lVar1;
  uint8_t *puVar2;
  long lVar3;
  
  puVar2 = src + (long)width + -1;
  lVar1 = (long)width + -1;
  for (lVar3 = 0; lVar3 < lVar1; lVar3 = lVar3 + 2) {
    dst[lVar3] = *puVar2;
    dst[lVar3 + 1] = puVar2[-1];
    puVar2 = puVar2 + -2;
  }
  if ((width & 1U) != 0) {
    dst[lVar1] = *puVar2;
  }
  return;
}

Assistant:

void MirrorRow_C(const uint8_t* src, uint8_t* dst, int width) {
  int x;
  src += width - 1;
  for (x = 0; x < width - 1; x += 2) {
    dst[x] = src[0];
    dst[x + 1] = src[-1];
    src -= 2;
  }
  if (width & 1) {
    dst[width - 1] = src[0];
  }
}